

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O0

void __thiscall OpenMD::NameFinder::NameFinder(NameFinder *this,SimInfo *info)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  NameFinder *in_stack_00000560;
  value_type_conflict1 *in_stack_ffffffffffffff48;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff50;
  vector<int,_std::allocator<int>_> *this_00;
  
  *in_RDI = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3ef8e5);
  std::shared_ptr<OpenMD::TreeNode>::shared_ptr
            ((shared_ptr<OpenMD::TreeNode> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  SimInfo::getNGlobalAtoms((SimInfo *)*in_RDI);
  SimInfo::getNGlobalRigidBodies((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  SimInfo::getNGlobalBonds((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  SimInfo::getNGlobalBends((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  SimInfo::getNGlobalTorsions((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  SimInfo::getNGlobalInversions((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 1);
  SimInfo::getNGlobalMolecules((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,in_stack_ffffffffffffff48);
  loadNames(in_stack_00000560);
  return;
}

Assistant:

NameFinder::NameFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    loadNames();
  }